

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
::moveFromSpan(Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
               *this,Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                     *fromSpan,size_t fromIndex,size_t to)

{
  byte bVar1;
  long lVar2;
  Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_> SVar3;
  Entry *pEVar4;
  
  SVar3 = this[0x89];
  if (SVar3 == this[0x88]) {
    addStorage(this);
    SVar3 = this[0x89];
  }
  this[to] = SVar3;
  lVar2 = *(long *)(this + 0x80);
  SVar3 = this[0x89];
  this[0x89] = *(Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
                 *)(lVar2 + (ulong)(byte)SVar3 * 0x28);
  bVar1 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar4 = fromSpan->entries;
  Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>::Node
            ((Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_> *)
             (lVar2 + (ulong)(byte)SVar3 * 0x28),
             (Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_> *)(pEVar4 + bVar1));
  pEVar4 = pEVar4 + bVar1;
  std::_Function_base::~_Function_base((_Function_base *)((pEVar4->storage).data + 8));
  (pEVar4->storage).data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar1;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }